

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

bool ncnn::vstr_is_float(char *vstr)

{
  char cVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    cVar1 = vstr[lVar3];
    if (cVar1 == '\0') {
      return false;
    }
    if ((cVar1 == '.') || (iVar2 = tolower((int)cVar1), iVar2 == 0x65)) break;
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x10) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool vstr_is_float(const char vstr[16])
{
    // look ahead for determine isfloat
    for (int j=0; j<16; j++)
    {
        if (vstr[j] == '\0')
            break;

        if (vstr[j] == '.' || tolower(vstr[j]) == 'e')
            return true;
    }

    return false;
}